

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::a64::ARMRAPass::_rewrite(ARMRAPass *this,BaseNode *first,BaseNode *stop)

{
  InstNode IVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  InstNode *pIVar5;
  long *plVar6;
  byte *pbVar7;
  BaseBuilder *this_00;
  undefined8 uVar8;
  bool bVar9;
  Signature SVar10;
  uint32_t uVar11;
  Error EVar12;
  VirtReg **ppVVar13;
  Operand *pOVar14;
  Operand_ *o0;
  InstId instId;
  long lVar15;
  Operand_ *pOVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  Operand_ local_98;
  ARMRAPass *local_88;
  BitWordIterator<unsigned_int> useIt;
  uint32_t uStack_78;
  InstNode *local_68;
  BitWordIterator<unsigned_int> outIt;
  
  uVar3 = *(uint *)&(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].super_BaseEmitter.
                    _logger;
  local_88 = this;
  pIVar5 = (InstNode *)first;
LAB_00133357:
  do {
    do {
      local_68 = pIVar5;
      if (local_68 == (InstNode *)stop) {
        return 0;
      }
      pIVar5 = *(InstNode **)(local_68 + 8);
    } while (((byte)local_68[0x11] & 0x20) == 0);
    plVar6 = *(long **)(local_68 + 0x20);
    IVar1 = local_68[0x12];
    if (plVar6 != (long *)0x0) {
      uVar18 = *(uint *)(plVar6 + 2);
      for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
        lVar15 = uVar17 * 0x20;
        SVar10._bits = *(uint32_t *)((long)plVar6 + lVar15 + 100);
        _useIt = SVar10._bits;
        bVar2 = *(byte *)((long)plVar6 + lVar15 + 0x5a);
        while (this = local_88, SVar10._bits != 0) {
          uVar11 = Support::BitWordIterator<unsigned_int>::next(&useIt);
          InstNode::rewriteIdAtIndex(local_68,uVar11,(uint)bVar2);
          SVar10._bits = _useIt;
        }
        _outIt = *(uint32_t *)(plVar6 + uVar17 * 4 + 0xd);
        bVar2 = *(byte *)((long)plVar6 + lVar15 + 0x5b);
        while (_outIt != 0) {
          uVar11 = Support::BitWordIterator<unsigned_int>::next(&outIt);
          InstNode::rewriteIdAtIndex(local_68,uVar11,(uint)bVar2);
        }
      }
      *(undefined8 *)(local_68 + 0x20) = 0;
      if (local_68[0x10] == (InstNode)0x11) {
        lVar15 = *plVar6;
        bVar9 = BaseRAPass::isNextTo
                          (&this->super_BaseRAPass,(BaseNode *)local_68,
                           (BaseNode *)((this->super_BaseRAPass)._func)->_exitNode);
        if (!bVar9) {
          ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor = *(BaseNode **)local_68
          ;
          uStack_78 = *(uint32_t *)(((this->super_BaseRAPass)._func)->_exitNode + 0x30);
          _useIt = 5;
          EVar12 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                             (this,(Operand_ *)&useIt);
          if (EVar12 != 0) {
            return EVar12;
          }
        }
        uVar8 = *(undefined8 *)local_68;
        BaseBuilder::removeNode
                  ((local_88->super_BaseRAPass).super_FuncPass.super_Pass._cb,(BaseNode *)local_68);
        *(undefined8 *)(lVar15 + 0x18) = uVar8;
        this = local_88;
      }
    }
    for (lVar15 = 0; (ulong)(byte)IVar1 << 4 != lVar15; lVar15 = lVar15 + 0x10) {
      if ((*(uint *)(local_68 + lVar15 + 0x40) & 0x2007) == 0x2002) {
        if (uVar3 <= *(int *)(local_68 + lVar15 + 0x44) - 0x100U) {
          return 0x1e;
        }
        ppVVar13 = ZoneVector<asmjit::v1_14::VirtReg_*>::operator[]
                             ((ZoneVector<asmjit::v1_14::VirtReg_*> *)
                              &(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].
                               super_BaseEmitter._code,
                              (ulong)(*(int *)(local_68 + lVar15 + 0x44) - 0x100U));
        if (*(long *)(*ppVVar13 + 0x28) == 0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/a64rapass.cpp"
                     ,0x2c7,"workReg != nullptr");
        }
        pbVar7 = *(byte **)(*(long *)(*ppVVar13 + 0x28) + 0x18);
        iVar4 = *(int *)(pbVar7 + 0x10);
        uVar18 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature._bits;
        *(uint *)(local_68 + lVar15 + 0x44) = (uint)*pbVar7;
        *(uint *)(local_68 + lVar15 + 0x40) =
             *(uint *)(local_68 + lVar15 + 0x40) & 0xffffdf07 | uVar18 & 0xf8;
        *(int *)(local_68 + lVar15 + 0x4c) = *(int *)(local_68 + lVar15 + 0x4c) + iVar4;
      }
    }
  } while (((*(short *)(local_68 + 0x30) != 6) || (local_68[0x12] != (InstNode)0x2)) ||
          (pOVar14 = InstNode::op(local_68,1), ((pOVar14->super_Operand_)._signature._bits & 7) != 2
          ));
  pOVar14 = InstNode::op(local_68,1);
  uVar18 = (pOVar14->super_Operand_)._signature._bits;
  uVar11 = (pOVar14->super_Operand_)._data[1];
  uVar17 = CONCAT44((pOVar14->super_Operand_)._baseId,uVar11);
  if ((uVar18 & 0xf8) != 0) {
    uVar17 = (long)(int)uVar11;
  }
  pOVar16 = (Operand_ *)&useIt;
  if ((uVar18 & 0x1ff8) != 0) goto code_r0x00133548;
  *(undefined4 *)(local_68 + 0x30) = 0xf4;
  _useIt = 4;
  uStack_78 = 0;
  uVar11 = 1;
  goto LAB_0013370d;
code_r0x00133548:
  if ((uVar18 & 0x1f00) != 0) {
    return 0x2c;
  }
  pOVar14 = InstNode::op(local_68,0);
  uStack_78 = (pOVar14->super_Operand_)._baseId;
  _useIt = 0x8000039;
  _outIt = 0x8000039;
  instId = 3;
  if ((long)uVar17 < 0) {
    instId = 0x174;
  }
  uVar19 = -uVar17;
  if (0 < (long)uVar17) {
    uVar19 = uVar17;
  }
  *(InstId *)(local_68 + 0x30) = instId;
  local_68[0x12] = (InstNode)0x3;
  InstNode::setOp(local_68,1,(Operand_ *)&outIt);
  local_98._signature._bits = 4;
  local_98._baseId = 0;
  uVar18 = (uint)uVar19;
  uVar11 = (uint32_t)(uVar19 >> 0x20);
  local_98._data[0] = uVar18;
  local_98._data[1] = uVar11;
  InstNode::setOp(local_68,2,&local_98);
  this = local_88;
  if ((uVar19 & 0xffffffffff000fff) != 0 && 0xfff < uVar19) {
    this_00 = (local_88->super_BaseRAPass).super_FuncPass.super_Pass._cb;
    this_00->_cursor = *(BaseNode **)local_68;
    if (uVar19 < 0x1000000) {
      local_98._data[0] = uVar18 & 0xfff;
      local_98._signature._bits = 4;
      local_98._baseId = 0;
      local_98._data[1] = 0;
      EVar12 = BaseEmitter::_emitI(&this_00->super_BaseEmitter,instId,(Operand_ *)&useIt,
                                   (Operand_ *)&outIt,&local_98);
      if (EVar12 != 0) {
        return EVar12;
      }
      InstNode::setOp(local_68,1,(Operand_ *)&useIt);
      local_98._data[0] = uVar18 & 0xfff000;
      local_98._signature._bits = 4;
      local_98._baseId = 0;
      local_98._data[1] = 0;
      uVar11 = 2;
      pOVar16 = &local_98;
    }
    else {
      o0 = &InstNode::op(local_68,0)->super_Operand_;
      local_98._signature._bits = 4;
      local_98._baseId = 0;
      local_98._data[0] = uVar18;
      local_98._data[1] = uVar11;
      EVar12 = BaseEmitter::_emitI(&this_00->super_BaseEmitter,0xf4,o0,&local_98);
      if (EVar12 != 0) {
        return EVar12;
      }
      InstNode::setOp(local_68,1,(Operand_ *)&outIt);
      uVar11 = 2;
    }
LAB_0013370d:
    InstNode::setOp(local_68,uVar11,pOVar16);
    this = local_88;
  }
  goto LAB_00133357;
}

Assistant:

ASMJIT_FAVOR_SPEED Error ARMRAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // If the instruction contains pass data (raInst) then it was a subject
        // for register allocation and must be rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext())
            inst->rewriteIdAtIndex(useIt.next(), useId);

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext())
            inst->rewriteIdAtIndex(outIt.next(), outId);
        }

        // This data is allocated by Zone passed to `runOnFunction()`, which
        // will be reset after the RA pass finishes. So reset this data to
        // prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit
          // label is next to it (optimization) or patched to an architecture
          // dependent jump instruction that jumps to the function's exit before
          // the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }

      // Rewrite `loadAddressOf()` construct.
      if (inst->realId() == Inst::kIdAdr && inst->opCount() == 2 && inst->op(1).isMem()) {
        BaseMem mem = inst->op(1).as<BaseMem>();
        int64_t offset = mem.offset();

        if (!mem.hasBaseOrIndex()) {
          inst->setId(Inst::kIdMov);
          inst->setOp(1, Imm(offset));
        }
        else {
          if (mem.hasIndex())
            return DebugUtils::errored(kErrorInvalidAddressIndex);

          GpX dst(inst->op(0).as<Gp>().id());
          GpX base(mem.baseId());

          InstId arithInstId = offset < 0 ? Inst::kIdSub : Inst::kIdAdd;
          uint64_t absOffset = offset < 0 ? Support::neg(uint64_t(offset)) : uint64_t(offset);

          inst->setId(arithInstId);
          inst->setOpCount(3);
          inst->setOp(1, base);
          inst->setOp(2, Imm(absOffset));

          // Use two operations if the offset cannot be encoded with ADD/SUB.
          if (absOffset > 0xFFFu && (absOffset & ~uint64_t(0xFFF000u)) != 0) {
            if (absOffset <= 0xFFFFFFu) {
              cc()->_setCursor(inst->prev());
              ASMJIT_PROPAGATE(cc()->emit(arithInstId, dst, base, Imm(absOffset & 0xFFFu)));

              inst->setOp(1, dst);
              inst->setOp(2, Imm(absOffset & 0xFFF000u));
            }
            else {
              cc()->_setCursor(inst->prev());
              ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, inst->op(0), Imm(absOffset)));

              inst->setOp(1, base);
              inst->setOp(2, dst);
            }
          }
        }
      }
    }

    node = next;
  }

  return kErrorOk;
}